

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

bool bloaty::RollupOutput::IsSame(string *a,string *b)

{
  size_t __n;
  ulong uVar1;
  pointer pcVar2;
  pointer pcVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  __n = a->_M_string_length;
  uVar1 = b->_M_string_length;
  if (__n == uVar1) {
    if (__n == 0) {
      return true;
    }
    iVar4 = bcmp((a->_M_dataplus)._M_p,(b->_M_dataplus)._M_p,__n);
    if (iVar4 == 0) {
      return true;
    }
  }
  pcVar2 = (b->_M_dataplus)._M_p;
  local_70 = local_60;
  pcVar3 = (a->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar3,pcVar3 + __n);
  std::__cxx11::string::append((char *)&local_70);
  bVar6 = true;
  bVar5 = true;
  if (local_68 != 0) {
    if (uVar1 < local_68) {
      bVar5 = false;
    }
    else {
      iVar4 = bcmp(pcVar2 + (uVar1 - local_68),local_70,local_68);
      bVar5 = iVar4 == 0;
    }
  }
  if (!bVar5) {
    pcVar2 = (a->_M_dataplus)._M_p;
    uVar1 = a->_M_string_length;
    local_50 = local_40;
    pcVar3 = (b->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + b->_M_string_length);
    std::__cxx11::string::append((char *)&local_50);
    if (local_48 != 0) {
      if (uVar1 < local_48) {
        bVar6 = false;
      }
      else {
        iVar4 = bcmp(pcVar2 + (uVar1 - local_48),local_50,local_48);
        bVar6 = iVar4 == 0;
      }
    }
  }
  if ((!bVar5) && (local_50 != local_40)) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return bVar6;
}

Assistant:

bool RollupOutput::IsSame(const std::string& a, const std::string& b) {
  if (a == b) {
    return true;
  }

  if (absl::EndsWith(b, a + "]") || absl::EndsWith(a, b + "]")) {
    return true;
  }

  return false;
}